

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

void __thiscall cfd::UtxoData::UtxoData(UtxoData *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  core::BlockHash::BlockHash((BlockHash *)0x5083f8);
  core::Txid::Txid((Txid *)(in_RDI + 5));
  *(undefined4 *)(in_RDI + 9) = 0;
  core::Script::Script((Script *)(in_RDI + 10));
  core::Script::Script((Script *)(in_RDI + 0x11));
  core::Address::Address((Address *)(in_RDI + 0x18));
  std::__cxx11::string::string((string *)(in_RDI + 0x47));
  core::Amount::Amount((Amount *)(in_RDI + 0x4b));
  *(undefined4 *)(in_RDI + 0x4d) = 1;
  in_RDI[0x4e] = 0;
  core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)(in_RDI + 0x4f));
  core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)(in_RDI + 0x54));
  core::BlindFactor::BlindFactor((BlindFactor *)(in_RDI + 0x8a));
  core::BlindFactor::BlindFactor((BlindFactor *)(in_RDI + 0x8e));
  core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)(in_RDI + 0x92));
  core::Script::Script((Script *)(in_RDI + 0x97));
  return;
}

Assistant:

UtxoData::UtxoData() {
  // do nothing
}